

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seismogram.cpp
# Opt level: O3

void __thiscall
CombinedSeismogramm<float,_3>::Load
          (CombinedSeismogramm<float,_3> *this,SeismoType type,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths)

{
  vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_> *pvVar1;
  pointer pcVar2;
  pointer pSVar3;
  float *pfVar4;
  double dVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  int iVar7;
  uint uVar8;
  pointer pbVar9;
  undefined4 *puVar10;
  ostream *poVar11;
  ulong uVar12;
  ulong uVar13;
  uint16 uVar14;
  uint uVar15;
  long lVar16;
  uint16 uVar17;
  long lVar18;
  ulong uVar19;
  ulong unaff_R12;
  IndexType k;
  uint uVar20;
  pointer pSVar21;
  CombinedSeismogramm<float,_3> *this_00;
  long lVar22;
  float fVar23;
  float fVar24;
  string filename;
  vector<float,_std::allocator<float>_> rec_y;
  vector<float,_std::allocator<float>_> rec_x;
  string filename_source;
  string filename_rec;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v_1;
  ifstream ifs_source;
  ifstream ifs_rec;
  ifstream ifs;
  ifstream ifs0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9d8;
  ulong local_9b8;
  long *local_9b0;
  long local_9a8;
  long local_9a0 [2];
  float local_990;
  float local_98c;
  ulong local_988;
  ulong local_980;
  ulong local_978;
  CombinedSeismogramm<float,_3> *local_970;
  vector<float,_std::allocator<float>_> local_968;
  vector<float,_std::allocator<float>_> local_948;
  long local_930;
  long *local_928 [2];
  long local_918 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_908;
  ulong local_900;
  ulong local_8f8;
  vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_> *local_8f0;
  ulong local_8e8;
  long *local_8e0 [2];
  long local_8d0 [2];
  long local_8c0;
  ulong local_8b8;
  ulong local_8b0;
  long local_8a8;
  pointer local_8a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_898;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_880;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_868;
  byte abStack_848 [496];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_658;
  byte abStack_638 [496];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_448 [22];
  long local_238 [4];
  byte abStack_218 [488];
  
  pvVar1 = &this->seismogramms;
  std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::resize
            (pvVar1,((long)(this->componentInfos).
                           super__Vector_base<CombinedSeismogramm<float,_3>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_3>::ComponentInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->componentInfos).
                           super__Vector_base<CombinedSeismogramm<float,_3>::ComponentInfo,_std::allocator<CombinedSeismogramm<float,_3>::ComponentInfo>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333);
  if (type == CSV) {
    std::vector<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>::resize
              (pvVar1,((long)(paths->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(paths->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 5) * 3);
    pbVar9 = (paths->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((paths->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish != pbVar9) {
      local_930 = 0;
      local_900 = 0;
      local_970 = this;
      local_908 = paths;
      local_8f0 = pvVar1;
      do {
        local_9b0 = local_9a0;
        local_8c0 = local_900 * 0x20;
        pcVar2 = pbVar9[local_900]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_9b0,pcVar2,pcVar2 + pbVar9[local_900]._M_string_length);
        std::__cxx11::string::append((char *)&local_9b0);
        std::ifstream::ifstream((istream *)local_238);
        std::ifstream::open((char *)local_238,(_Ios_Openmode)local_9b0);
        if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) goto LAB_0010a491;
        getNextLineAndSplitIntoTokens_abi_cxx11_(&local_9d8,(istream *)local_238,';');
        uVar15 = (uint)((long)local_9d8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_9d8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5);
        uVar20 = uVar15 - 1;
        iVar7 = std::__cxx11::string::compare
                          ((char *)(local_9d8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + -1));
        uVar8 = uVar20;
        if (iVar7 != 0) {
          uVar8 = uVar15;
        }
        local_8f8 = (ulong)uVar8;
        local_980 = 0xffffffff;
        local_988 = (ulong)uVar20;
        if (local_8f8 <=
            (ulong)((long)local_9d8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_9d8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5)) {
          local_980 = 0xffffffff;
          do {
            getNextLineAndSplitIntoTokens_abi_cxx11_(&local_658,(istream *)local_238,';');
            local_448[0].
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_9d8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_448[0].
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_9d8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_448[0].
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_9d8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_9d8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_658.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_9d8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_658.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_9d8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_658.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_658.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_658.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_658.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(local_448);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_658);
            local_980 = (ulong)((int)local_980 + 1);
          } while (local_8f8 <=
                   (ulong)((long)local_9d8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_9d8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        std::ifstream::close();
        std::ifstream::ifstream((istream *)local_448);
        std::ifstream::open((char *)local_448,(_Ios_Openmode)local_9b0);
        getNextLineAndSplitIntoTokens_abi_cxx11_(&local_880,(istream *)local_448,';');
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_880);
        getNextLineAndSplitIntoTokens_abi_cxx11_(&local_868,(istream *)local_448,';');
        local_658.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_9d8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_658.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_9d8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_658.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_9d8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_9b8 = local_988 * 0xaaaaaaab >> 0x21;
        local_9d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_868.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_9d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_868.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_9d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_868.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_868.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_868.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_868.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_658);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_868);
        local_8b8 = (ulong)(uint)((int)local_900 * 3);
        lVar16 = 0;
        do {
          uVar13 = (ulong)(uint)((int)local_930 + (int)lVar16);
          pSVar3 = (this->seismogramms).
                   super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar12 = ((long)(this->seismogramms).
                          super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3 >> 6) *
                   0x6db6db6db6db6db7;
          if (uVar12 < uVar13 || uVar12 - uVar13 == 0) goto LAB_0010a46d;
          std::
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ::resize(&pSVar3[uVar13].data,
                   (((long)local_9d8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_9d8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) / 3);
          lVar16 = lVar16 + 1;
        } while (lVar16 != 3);
        unaff_R12 = local_980 & 0xffffffff;
        if (2 < (uint)local_988) {
          iVar7 = (int)local_9b8;
          uVar12 = 0;
          do {
            lVar16 = 0;
            do {
              uVar19 = (ulong)(uint)((int)local_930 + (int)lVar16);
              pSVar3 = (local_970->seismogramms).
                       super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              uVar13 = ((long)(local_970->seismogramms).
                              super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3 >> 6) *
                       0x6db6db6db6db6db7;
              if (uVar13 < uVar19 || uVar13 - uVar19 == 0) {
                std::__throw_out_of_range_fmt
                          (
                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          );
                uVar12 = local_978;
                goto LAB_0010a457;
              }
              std::vector<float,_std::allocator<float>_>::resize
                        ((vector<float,_std::allocator<float>_> *)
                         (uVar12 * 0x18 +
                         *(long *)&pSVar3[uVar19].data.
                                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                   ._M_impl),unaff_R12);
              lVar16 = lVar16 + 1;
            } while (lVar16 != 3);
            uVar12 = uVar12 + 1;
          } while (uVar12 != iVar7 + (uint)(iVar7 == 0));
        }
        this_00 = local_970;
        std::vector<float,_std::allocator<float>_>::resize(&local_970->times,unaff_R12);
        if (local_8f8 <=
            (ulong)((long)local_9d8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_9d8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5)) {
          local_8b0 = local_8b8 & 0xffffffff;
          local_978 = (ulong)((int)local_8b8 + 1);
          local_8e8 = (ulong)((int)local_8b8 + 2);
          local_8a8 = (ulong)((int)local_9b8 + (uint)((int)local_9b8 == 0)) * 0x18;
          uVar15 = 0;
          do {
            pbVar9 = local_9d8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            dVar5 = atof(((local_9d8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
            uVar13 = (ulong)uVar15;
            (this_00->times).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[uVar13] = (float)dVar5;
            if (2 < (uint)local_988) {
              pSVar3 = (local_970->seismogramms).
                       super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              unaff_R12 = ((long)(local_970->seismogramms).
                                 super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3 >> 6) *
                          0x6db6db6db6db6db7;
              uVar12 = local_8b0;
              if (unaff_R12 < local_8b0 || unaff_R12 - local_8b0 == 0) goto LAB_0010a457;
              local_8a0 = pSVar3 + local_978;
              pSVar21 = pSVar3 + local_8e8;
              lVar16 = *(long *)&pSVar3[local_8b0].data.
                                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                 ._M_impl;
              lVar18 = 0;
              do {
                dVar5 = atof(*(char **)((long)&pbVar9[1]._M_dataplus._M_p + lVar18 * 4));
                *(float *)(*(long *)(lVar16 + lVar18) + uVar13 * 4) = (float)dVar5;
                uVar12 = local_978;
                if (unaff_R12 < local_978 || unaff_R12 - local_978 == 0) goto LAB_0010a457;
                dVar5 = atof(*(char **)((long)&pbVar9[2]._M_dataplus._M_p + lVar18 * 4));
                *(float *)(*(long *)(*(long *)&(local_8a0->data).
                                               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                               ._M_impl + lVar18) + uVar13 * 4) = (float)dVar5;
                uVar12 = local_8e8;
                if (unaff_R12 < local_8e8 || unaff_R12 - local_8e8 == 0) goto LAB_0010a457;
                dVar5 = atof(*(char **)((long)&pbVar9[3]._M_dataplus._M_p + lVar18 * 4));
                *(float *)(*(long *)(*(long *)&(pSVar21->data).
                                               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                               ._M_impl + lVar18) + uVar13 * 4) = (float)dVar5;
                lVar18 = lVar18 + 0x18;
              } while (local_8a8 != lVar18);
            }
            getNextLineAndSplitIntoTokens_abi_cxx11_(&local_868,(istream *)local_448,';');
            local_658.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_9d8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_658.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_9d8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_658.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_9d8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_9d8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_868.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_9d8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_868.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_9d8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_868.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_868.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_868.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_868.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_658);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_868);
            uVar15 = uVar15 + 1;
            this_00 = local_970;
          } while (local_8f8 <=
                   (ulong)((long)local_9d8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_9d8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        uVar12 = (ulong)((int)local_980 - 1);
        pfVar4 = (this_00->times).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        interpolate_data_on_equal_time_intervals
                  (this_00,((pfVar4[uVar12] - *pfVar4) / (float)uVar12) *
                           this_00->interpolation_multiplier);
        iVar7 = *(int *)&(this_00->times).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish;
        pfVar4 = (this_00->times).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dVar5 = floor((double)(pfVar4[1] - *pfVar4) * 1000000.0 + 0.5);
        pvVar1 = local_8f0;
        lVar16 = local_930;
        uVar12 = local_9b8;
        lVar18 = 0;
        do {
          uVar15 = (int)lVar18 + (int)lVar16;
          pSVar3 = (pvVar1->
                   super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          pSVar3[uVar15].header_data.job_id = 1;
          pSVar3[uVar15].header_data.line_num = 1;
          pSVar3[uVar15].header_data.reel_num = 1;
          pSVar3[uVar15].header_data.num_of_traces_per_record = (uint16)uVar12;
          pSVar3[uVar15].header_data.num_of_auxiliary_traces_per_record = 0;
          uVar17 = (uint16)(long)dVar5;
          pSVar3[uVar15].header_data.sample_interval_reel = uVar17;
          pSVar3[uVar15].header_data.sample_interval = uVar17;
          uVar14 = (uint16)((uint)(iVar7 - (int)pfVar4) >> 2);
          pSVar3[uVar15].header_data.samples_per_trace_reel = uVar14;
          pSVar3[uVar15].header_data.samples_per_trace = uVar14;
          pSVar3[uVar15].header_data.data_sample_format = 5;
          lVar18 = lVar18 + 1;
          memset(pSVar3[uVar15].header_data.other,0,0x176);
        } while (lVar18 != 3);
        pbVar9 = (local_908->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_8e0[0] = local_8d0;
        lVar16 = *(long *)((long)&(pbVar9->_M_dataplus)._M_p + local_8c0);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_8e0,lVar16,
                   *(long *)((long)&pbVar9->_M_string_length + local_8c0) + lVar16);
        std::__cxx11::string::append((char *)local_8e0);
        std::ifstream::ifstream(&local_658);
        std::ifstream::open((char *)&local_658,(_Ios_Openmode)local_8e0[0]);
        local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (float *)0x0;
        local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (float *)0x0;
        local_968.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (float *)0x0;
        local_968.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_968.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (float *)0x0;
        if ((abStack_638
             [local_658.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length] & 5) == 0) {
          if (2 < (uint)local_988) {
            iVar7 = (int)local_9b8 + (uint)((int)local_9b8 == 0);
            do {
              getNextLineAndSplitIntoTokens_abi_cxx11_(&local_868,(istream *)&local_658,';');
              pbVar9 = local_868.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar12 = (long)local_868.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_868.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
              if (uVar12 < 0x21) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Error while reading receivers data",0x22);
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
                std::ostream::put('8');
                std::ostream::flush();
              }
              else {
                dVar5 = atof(((local_868.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
                local_928[0] = (long *)CONCAT44(local_928[0]._4_4_,(float)dVar5);
                if (local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                            (&local_948,
                             (iterator)
                             local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_finish,(float *)local_928);
                  uVar12 = (long)local_868.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_868.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                  pbVar9 = local_868.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                }
                else {
                  *local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish = (float)dVar5;
                  local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
                unaff_R12 = (long)uVar12 >> 5;
                if (unaff_R12 < 2) goto LAB_0010a47b;
                dVar5 = atof(pbVar9[1]._M_dataplus._M_p);
                local_928[0] = (long *)CONCAT44(local_928[0]._4_4_,(float)dVar5);
                if (local_968.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_968.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                            (&local_968,
                             (iterator)
                             local_968.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_finish,(float *)local_928);
                }
                else {
                  *local_968.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish = (float)dVar5;
                  local_968.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_968.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_868);
              iVar7 = iVar7 + -1;
            } while (iVar7 != 0);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Warning: no csv receivers data found",0x24);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
          std::ostream::put('8');
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "         All receivers positions have been set to (0.0, 0.0)",0x3c);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
          std::ostream::put('8');
          std::ostream::flush();
          if (2 < (uint)local_988) {
            iVar7 = (int)local_9b8 + (uint)((int)local_9b8 == 0);
            do {
              local_868.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)((ulong)local_868.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
              if (local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                          (&local_948,
                           (iterator)
                           local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish,(float *)&local_868);
              }
              else {
                *local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish = 0.0;
                local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              local_868.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)((ulong)local_868.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
              if (local_968.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_968.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                          (&local_968,
                           (iterator)
                           local_968.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish,(float *)&local_868);
              }
              else {
                *local_968.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish = 0.0;
                local_968.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_968.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              iVar7 = iVar7 + -1;
            } while (iVar7 != 0);
          }
        }
        pbVar9 = (local_908->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_928[0] = local_918;
        lVar16 = *(long *)((long)&(pbVar9->_M_dataplus)._M_p + local_8c0);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_928,lVar16,
                   *(long *)((long)&pbVar9->_M_string_length + local_8c0) + lVar16);
        std::__cxx11::string::append((char *)local_928);
        std::ifstream::ifstream((istream *)&local_868);
        std::ifstream::open((char *)&local_868,(_Ios_Openmode)local_928[0]);
        if ((abStack_848
             [local_868.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length] & 5) == 0) {
          getNextLineAndSplitIntoTokens_abi_cxx11_(&local_898,(istream *)&local_868,';');
          pbVar9 = local_898.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)local_898.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_898.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Error while reading source data",0x1f);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
            std::ostream::put('8');
            std::ostream::flush();
          }
          else {
            dVar5 = atof(((local_898.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
            local_98c = (float)dVar5;
            dVar5 = atof(pbVar9[1]._M_dataplus._M_p);
            local_990 = (float)dVar5;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_898);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Warning: no csv source data found",0x21);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
          std::ostream::put('8');
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"         Source position has been set to (0.0, 0.0)",
                     0x33);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
          std::ostream::put('8');
          std::ostream::flush();
          local_98c = 0.0;
          local_990 = 0.0;
        }
        local_978 = local_9b8 & 0xffffffff;
        lVar18 = (long)local_98c;
        lVar22 = (long)local_990;
        local_9b8 = (ulong)((int)local_9b8 + (uint)((int)local_9b8 == 0));
        lVar16 = 0;
        do {
          uVar12 = (ulong)(uint)((int)local_8b8 + (int)lVar16);
          unaff_R12 = uVar12 * 0x1c0;
          std::vector<segy_trace_header,_std::allocator<segy_trace_header>_>::resize
                    (&(local_8f0->
                      super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>).
                      _M_impl.super__Vector_impl_data._M_start[uVar12].trace_header_data,local_978);
          if (2 < (uint)local_988) {
            puVar10 = *(undefined4 **)
                       &(local_8f0->
                        super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[uVar12].trace_header_data.
                        super__Vector_base<segy_trace_header,_std::allocator<segy_trace_header>_>.
                        _M_impl;
            uVar12 = 0;
            do {
              *puVar10 = (int)uVar12;
              puVar10[1] = (int)uVar12;
              *(short *)(puVar10 + 7) = (short)uVar12;
              fVar23 = local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar12];
              puVar10[0x14] = (int)(long)fVar23;
              fVar24 = local_968.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar12];
              puVar10[0x15] = (int)(long)fVar24;
              puVar10[0x12] = (int)lVar18;
              puVar10[0x13] = (int)lVar22;
              *(undefined8 *)(puVar10 + 2) = 0x100000001;
              *(uint16 *)((long)puVar10 + 0x72) = uVar14;
              *(uint16 *)(puVar10 + 0x1d) = uVar17;
              *(undefined2 *)(puVar10 + 0x16) = 1;
              fVar23 = fVar23 - local_98c;
              fVar24 = fVar24 - local_990;
              puVar10[9] = (int)(long)SQRT(fVar23 * fVar23 + fVar24 * fVar24 + 0.5);
              uVar12 = uVar12 + 1;
              puVar10 = puVar10 + 0x3c;
            } while (local_9b8 != uVar12);
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 != 3);
        std::ifstream::~ifstream(&local_868);
        if (local_928[0] != local_918) {
          operator_delete(local_928[0],local_918[0] + 1);
        }
        pvVar6 = local_908;
        this = local_970;
        if (local_968.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_968.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_968.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_968.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_948.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        std::ifstream::~ifstream(&local_658);
        if (local_8e0[0] != local_8d0) {
          operator_delete(local_8e0[0],local_8d0[0] + 1);
        }
        std::ifstream::~ifstream(local_448);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_9d8);
        std::ifstream::~ifstream(local_238);
        if (local_9b0 != local_9a0) {
          operator_delete(local_9b0,local_9a0[0] + 1);
        }
        local_900 = (ulong)((int)local_900 + 1);
        pbVar9 = (pvVar6->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_930 = local_930 + 3;
      } while (local_900 <
               (ulong)((long)(pvVar6->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5));
    }
  }
  else if ((type == SEG_Y) &&
          (pbVar9 = (paths->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start,
          (paths->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish != pbVar9)) {
    uVar15 = 1;
    uVar12 = 0;
    do {
      Seismogramm<float>::LoadSegY
                ((this->seismogramms).
                 super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar12,pbVar9 + uVar12,&this->times);
      uVar12 = (ulong)uVar15;
      pbVar9 = (paths->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar15 = uVar15 + 1;
    } while (uVar12 < (ulong)((long)(paths->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5)
            );
  }
  return;
LAB_0010a457:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar12,
             unaff_R12);
LAB_0010a46d:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0010a47b:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1,unaff_R12
            );
LAB_0010a491:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Error in reading CSV file.",0x1a);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"There is no such file: ",0x17);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(char *)local_9b0,local_9a8);
  std::endl<char,std::char_traits<char>>(poVar11);
  exit(1);
}

Assistant:

void CombinedSeismogramm<Scalar, dims>::Load(SeismoType type, std::vector<std::string> paths)
{
    seismogramms.resize(componentInfos.size());
    if (type == SEG_Y)
    {
        for (IndexType p = 0; p < paths.size(); ++p)
        {
            seismogramms[p].LoadSegY(paths[p], times);
        }
    }
    else if (type == CSV)
    {
        seismogramms.resize(paths.size() * dims);
        for (IndexType path_index = 0; path_index < paths.size(); path_index++)
        {
            // Calculating number of time steps and number of traces
            // ///////////////////////////////////////
            std::string filename = paths[path_index] + ".csv";
            IndexType num_of_times = -1;
            IndexType num_of_all_traces = 0;
            IndexType num_of_receivers;
            std::ifstream ifs0;
            ifs0.open(filename.c_str());
            if (!ifs0)
            {
                std::cout << "Error in reading CSV file." << std::endl;
                std::cout << "There is no such file: " << filename << std::endl;
                std::exit(1);
            }
            std::vector<std::string> line = getNextLineAndSplitIntoTokens(ifs0);
            num_of_all_traces = line.size() - 1;
            num_of_receivers = num_of_all_traces / dims;
            if (line.back() == "\r") num_of_all_traces -= 1;
            while (line.size() >= num_of_all_traces + 1)
            {
                line = getNextLineAndSplitIntoTokens(ifs0);
                num_of_times++;
            }
            ifs0.close();

            // Reading  data
            // ///////////////////////////////////////
            std::ifstream ifs;
            ifs.open(filename.c_str());
            getNextLineAndSplitIntoTokens(ifs);

            line = getNextLineAndSplitIntoTokens(ifs);

            for (int k = 0; k < dims; k++)
                seismogramms.at(dims * path_index + k).data.resize((line.size()-1)/dims);

            for (int trace_i = 0; trace_i < num_of_receivers; trace_i++)
            {
                for (int k = 0; k < dims; k++)
                    seismogramms.at(dims * path_index + k).data[trace_i].resize(num_of_times);
            }
            times.resize(num_of_times);

            IndexType time_i = 0;
            while (line.size() >= num_of_all_traces + 1)
            {
                times[time_i] = ::atof(line[0].c_str());
                for (int trace_i = 0; trace_i < num_of_receivers; trace_i++)
                {
                    seismogramms.at(dims * path_index + 0).data[trace_i][time_i] = ::atof(line[1 + trace_i * dims].c_str());
                    seismogramms.at(dims * path_index + 1).data[trace_i][time_i] = ::atof(line[2 + trace_i * dims].c_str());
                    if (dims >= 3)
                        seismogramms.at(dims * path_index + 2).data[trace_i][time_i] = ::atof(line[3 + trace_i * dims].c_str());
                }
                line = getNextLineAndSplitIntoTokens(ifs);
                time_i++;
            }

            // Interpolating results on eqidistant time grid
            // ///////////////////////////////////////

            Scalar interval = (times[num_of_times-1] - times[0]) / (num_of_times - 1);
            interpolate_data_on_equal_time_intervals(interval * interpolation_multiplier);
            num_of_times = times.size();
            interval = times[1] - times[0];


            // Set binary header data
            // ///////////////////////////////////////
            struct segy_bin_header_data header_data;
            header_data.sample_interval = (uint32)(floor(interval * 1000000.0 + 0.5));
            header_data.sample_interval_reel = header_data.sample_interval;


            header_data.job_id = 1;
            header_data.line_num = 1;
            header_data.reel_num = 1;
            header_data.num_of_traces_per_record = num_of_receivers;
            header_data.num_of_auxiliary_traces_per_record = 0;
            header_data.data_sample_format = 5;
            header_data.reel_num = 1;
            header_data.samples_per_trace = num_of_times;
            header_data.samples_per_trace_reel = header_data.samples_per_trace;
            for (int i = 0; i < 17; i++)
                header_data.other[i] = 0;
            for (int i = 0; i < 170; i++)
                header_data.reserve[i] = 0;

            for (IndexType k = 0; k < dims; k++)
            {
                seismogramms[dims*path_index + k].header_data = header_data;
            }



            // Set trace header data
            // ///////////////////////////////////////

            // Reading receivers data
            std::string filename_rec = paths[path_index] + ".receivers.csv";
            std::ifstream ifs_rec;
            ifs_rec.open(filename_rec.c_str());
            std::vector<Scalar> rec_x;
            std::vector<Scalar> rec_y;
            if (ifs_rec)
            {
                for (IndexType i = 0; i < num_of_receivers; i++)
                {
                    std::vector<std::string> v = getNextLineAndSplitIntoTokens(ifs_rec);
                    if (v.size() < 2)
                    {
                        std::cout << "Error while reading receivers data" << std::endl;
                    }
                    else
                    {
                        rec_x.push_back(::atof(v.at(0).c_str()));
                        rec_y.push_back(::atof(v.at(1).c_str()));
                    }
                }
            }
            else
            {
                std::cout << "Warning: no csv receivers data found" << std::endl;
                std::cout << "         All receivers positions have been set to (0.0, 0.0)" << std::endl;
                for (IndexType i = 0; i < num_of_receivers; i++)
                {
                    rec_x.push_back(0.0);
                    rec_y.push_back(0.0);
                }
            }

            // Reading source data
            std::string filename_source = paths[path_index] + ".source.csv";
            std::ifstream ifs_source;
            ifs_source.open(filename_source.c_str());
            Scalar source_x;
            Scalar source_y;
            if (ifs_source)
            {
                std::vector<std::string> v = getNextLineAndSplitIntoTokens(ifs_source);
                if (v.size() < 2)
                {
                    std::cout << "Error while reading source data" << std::endl;
                }
                else
                {
                    source_x = ::atof(v.at(0).c_str());
                    source_y = ::atof(v.at(1).c_str());
                }
            }
            else
            {
                std::cout << "Warning: no csv source data found" << std::endl;
                std::cout << "         Source position has been set to (0.0, 0.0)" << std::endl;
                source_x = 0.0;
                source_y = 0.0;
            }

            // Setting trace headers data

            for (IndexType k = 0; k < dims; k++)
            {
                seismogramms[dims*path_index + k].trace_header_data.resize(num_of_receivers);
                for (int i = 0; i < num_of_receivers; i++)
                {
                    seismogramms[dims*path_index + k].trace_header_data[i].trace_seq_num_line = i;
                    seismogramms[dims*path_index + k].trace_header_data[i].trace_seq_num_reel = i;
                    seismogramms[dims*path_index + k].trace_header_data[i].trace_id_code = i;
                    seismogramms[dims*path_index + k].trace_header_data[i].receiver_x = rec_x[i];
                    seismogramms[dims*path_index + k].trace_header_data[i].receiver_y = rec_y[i];
                    seismogramms[dims*path_index + k].trace_header_data[i].source_x = source_x;
                    seismogramms[dims*path_index + k].trace_header_data[i].source_y = source_y;
                    seismogramms[dims*path_index + k].trace_header_data[i].field_record_num = 1;
                    seismogramms[dims*path_index + k].trace_header_data[i].num_of_samples = header_data.samples_per_trace;
                    seismogramms[dims*path_index + k].trace_header_data[i].sample_interval = header_data.sample_interval;
                    seismogramms[dims*path_index + k].trace_header_data[i].trace_num_reel = 1;
                    seismogramms[dims*path_index + k].trace_header_data[i].units_id = 1;
                    seismogramms[dims*path_index + k].trace_header_data[i].distance_from_source =
                            uint32(sqrt(Scalar((rec_x[i]-source_x)*(rec_x[i]-source_x) + (rec_y[i]-source_y)*(rec_y[i]-source_y)) + 0.5));
                }
            }


        }
    }
}